

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O2

void burst::detail::
     radix_sort_impl_bi_iteration<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>,burst::low_byte_fn,long(*)[256],long*>
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      last,
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               buffer_begin,long param_4,long param_5,long param_6)

{
  long lVar1;
  long lVar2;
  size_t __n;
  long lVar3;
  
  __n = (long)last._M_current - (long)first._M_current;
  lVar3 = (long)__n >> 3;
  lVar1 = *(long *)(param_5 + param_6 * 8);
  lVar2 = *(long *)(param_5 + 8 + param_6 * 8);
  if (lVar2 != lVar3 || lVar1 != lVar3) {
    if (lVar1 == lVar3) {
      if (last._M_current != first._M_current) {
        memmove(buffer_begin._M_current,first._M_current,__n);
      }
    }
    else {
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>>,long*>
                (first,last,buffer_begin._M_current,SUB82(param_6,0),
                 (long *)(param_6 * 0x800 + param_4));
    }
    if (lVar2 == lVar3) {
      if (last._M_current != first._M_current) {
        memmove(first._M_current,buffer_begin._M_current,__n);
        return;
      }
    }
    else {
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>>,long*>
                (buffer_begin,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(buffer_begin._M_current + __n),first._M_current,SUB82(param_6 + 1,0),
                 (long *)(param_4 + (param_6 + 1) * 0x800));
    }
  }
  return;
}

Assistant:

void
            radix_sort_impl_bi_iteration
            (
                RandomAccessIterator1 first,
                RandomAccessIterator1 last,
                RandomAccessIterator2 buffer_begin,
                Map map,
                Radix radix,
                RandomAccessIterator3 counters,
                RandomAccessIterator4 maximums,
                std::size_t radix_number
            )
        {
            using std::distance;
            const auto range_size = distance(first, last);
            const auto buffer_end = std::next(buffer_begin, range_size);

            const auto nth_is_single = maximums[radix_number] == range_size;
            const auto n1th_is_single = maximums[radix_number + 1] == range_size;

            if (nth_is_single && n1th_is_single)
            {
                return;
            }

            if (nth_is_single)
            {
                std::move(first, last, buffer_begin);
            }
            else
            {
                dispose_backward(std::make_move_iterator(first), std::make_move_iterator(last), buffer_begin, compose(nth_radix(radix_number, radix), map), std::begin(counters[radix_number]));
            }

            if (n1th_is_single)
            {
                std::move(buffer_begin, buffer_end, first);
            }
            else
            {
                dispose_backward(std::make_move_iterator(buffer_begin), std::make_move_iterator(buffer_end), first, compose(nth_radix(radix_number + 1, radix), map), std::begin(counters[radix_number + 1]));
            }
        }